

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmOutputConverter *this,RelativeRoot remote,string *local,
          OutputFormat format)

{
  char *pcVar1;
  allocator local_61;
  string local_60;
  string result;
  
  Convert(&result,this,remote,local,format,true);
  pcVar1 = GetRelativeRootPath(this,remote);
  std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
  ConvertToOutputForExistingCommon(__return_storage_ptr__,this,&local_60,&result,format);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOutputConverter::ConvertToOutputForExisting(RelativeRoot remote,
                                              const std::string& local,
                                              OutputFormat format) const
{
  // Perform standard conversion.
  std::string result = this->Convert(remote, local, format, true);

  // Consider short-path.
  const char* remotePath = this->GetRelativeRootPath(remote);
  return this->ConvertToOutputForExistingCommon(remotePath, result, format);
}